

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_load_file(uchar **out,size_t *outsize,char *filename)

{
  FILE *__stream;
  size_t size_00;
  uchar *puVar1;
  size_t sVar2;
  long size;
  FILE *file;
  char *filename_local;
  size_t *outsize_local;
  uchar **out_local;
  
  *out = (uchar *)0x0;
  *outsize = 0;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    out_local._4_4_ = 0x4e;
  }
  else {
    fseek(__stream,0,2);
    size_00 = ftell(__stream);
    rewind(__stream);
    *outsize = 0;
    puVar1 = (uchar *)lodepng_malloc(size_00);
    *out = puVar1;
    if ((size_00 != 0) && (*out != (uchar *)0x0)) {
      sVar2 = fread(*out,1,size_00,__stream);
      *outsize = sVar2;
    }
    fclose(__stream);
    if ((*out == (uchar *)0x0) && (size_00 != 0)) {
      out_local._4_4_ = 0x53;
    }
    else {
      out_local._4_4_ = 0;
    }
  }
  return out_local._4_4_;
}

Assistant:

unsigned lodepng_load_file(unsigned char** out, size_t* outsize, const char* filename)
{
  FILE* file;
  long size;

  /*provide some proper output values if error will happen*/
  *out = 0;
  *outsize = 0;

  file = fopen(filename, "rb");
  if(!file) return 78;

  /*get filesize:*/
  fseek(file , 0 , SEEK_END);
  size = ftell(file);
  rewind(file);

  /*read contents of the file into the vector*/
  *outsize = 0;
  *out = (unsigned char*)lodepng_malloc((size_t)size);
  if(size && (*out)) (*outsize) = fread(*out, 1, (size_t)size, file);

  fclose(file);
  if(!(*out) && size) return 83; /*the above malloc failed*/
  return 0;
}